

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Totals * __thiscall Catch::Runner::runTests(Totals *__return_storage_ptr__,Runner *this)

{
  pointer *__return_storage_ptr___00;
  IStreamingReporter *pIVar1;
  size_t sVar2;
  pointer pFVar3;
  pointer pTVar4;
  int iVar5;
  undefined4 extraout_var;
  TestSpecParser *this_00;
  IRegistryHub *pIVar6;
  undefined4 extraout_var_00;
  iterator iVar7;
  undefined4 extraout_var_01;
  undefined1 auVar8 [8];
  undefined1 local_390 [8];
  RunContext context;
  undefined1 local_a8 [8];
  TestSpec testSpec;
  undefined1 auStack_88 [8];
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> skippedTestCases;
  undefined1 auStack_68 [8];
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> testCases;
  allocator local_31;
  
  context.m_unfinishedSections.
  super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(this->m_config).m_p;
  if ((Config *)
      context.m_unfinishedSections.
      super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (Config *)0x0) {
    (*(((Config *)
       context.m_unfinishedSections.
       super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_SharedImpl<Catch::IConfig>).
      super_IConfig.super_IShared.super_NonCopyable._vptr_NonCopyable[2])();
  }
  RunContext::RunContext
            ((RunContext *)local_390,
             (Ptr<const_Catch::IConfig> *)
             &context.m_unfinishedSections.
              super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->m_reporter);
  Ptr<const_Catch::IConfig>::~Ptr
            ((Ptr<const_Catch::IConfig> *)
             &context.m_unfinishedSections.
              super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->testCases).failedButOk = 0;
  (__return_storage_ptr__->assertions).failedButOk = 0;
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  std::__cxx11::string::string
            ((string *)
             &context.m_unfinishedSections.
              super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"all tests",(allocator *)auStack_68
            );
  RunContext::testGroupStarting
            ((RunContext *)local_390,
             (string *)
             &context.m_unfinishedSections.
              super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,1,1);
  std::__cxx11::string::~string
            ((string *)
             &context.m_unfinishedSections.
              super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar5 = (*(((this->m_config).m_p)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
            super_NonCopyable._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)local_a8,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar5));
  if (local_a8 ==
      (undefined1  [8])
      testSpec.m_filters.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_start) {
    TagAliasRegistry::get();
    std::__cxx11::string::string((string *)auStack_68,"~[.]",&local_31);
    this_00 = TestSpecParser::parse
                        ((TestSpecParser *)
                         &context.m_unfinishedSections.
                          super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)auStack_68);
    TestSpecParser::testSpec((TestSpec *)auStack_88,this_00);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::_M_move_assign
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)local_a8
               ,(vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
                auStack_88);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               auStack_88);
    std::__cxx11::string::~string((string *)auStack_68);
    TestSpecParser::~TestSpecParser
              ((TestSpecParser *)
               &context.m_unfinishedSections.
                super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  auStack_68 = (undefined1  [8])0x0;
  testCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  testCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  testSpec.m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)__return_storage_ptr__;
  pIVar6 = getRegistryHub();
  iVar5 = (*pIVar6->_vptr_IRegistryHub[3])(pIVar6);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x18))
            ((long *)CONCAT44(extraout_var_00,iVar5),local_a8,(this->m_config).m_p,auStack_68,0);
  pTVar4 = testCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
           super__Vector_impl_data._M_start;
  __return_storage_ptr___00 =
       &context.m_unfinishedSections.
        super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  for (auVar8 = auStack_68; auVar8 != (undefined1  [8])pTVar4;
      auVar8 = (undefined1  [8])((long)auVar8 + 0x118)) {
    iVar7 = std::
            _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
            ::find(&(this->m_testsAlreadyRun)._M_t,(key_type *)auVar8);
    sVar2 = context.m_totals.assertions.passed;
    if ((_Rb_tree_header *)iVar7._M_node ==
        &(this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header) {
      iVar5 = (**(code **)(*(long *)context.m_lastResult.m_resultData._64_8_ + 0x50))();
      if (sVar2 == (long)iVar5) break;
      RunContext::runTest((Totals *)__return_storage_ptr___00,(RunContext *)local_390,
                          (TestCase *)auVar8);
      Totals::operator+=((Totals *)
                         testSpec.m_filters.
                         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Totals *)__return_storage_ptr___00);
      std::
      _Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
      ::_M_insert_unique<Catch::TestCase_const&>
                ((_Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
                  *)&this->m_testsAlreadyRun,(TestCase *)auVar8);
    }
  }
  auStack_88 = (undefined1  [8])0x0;
  skippedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  skippedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar6 = getRegistryHub();
  iVar5 = (*pIVar6->_vptr_IRegistryHub[3])(pIVar6);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x18))
            ((long *)CONCAT44(extraout_var_01,iVar5),local_a8,(this->m_config).m_p,auStack_88,1);
  pTVar4 = skippedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (auVar8 = auStack_88; auVar8 != (undefined1  [8])pTVar4;
      auVar8 = (undefined1  [8])((long)auVar8 + 0x118)) {
    pIVar1 = (this->m_reporter).m_p;
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar1,auVar8);
  }
  std::__cxx11::string::string
            ((string *)
             &context.m_unfinishedSections.
              super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"all tests",&local_31);
  pFVar3 = testSpec.m_filters.
           super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  RunContext::testGroupEnded
            ((RunContext *)local_390,
             (string *)
             &context.m_unfinishedSections.
              super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Totals *)
             testSpec.m_filters.
             super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,1,1);
  std::__cxx11::string::~string
            ((string *)
             &context.m_unfinishedSections.
              super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)auStack_88);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)auStack_68);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)local_a8);
  RunContext::~RunContext((RunContext *)local_390);
  return (Totals *)pFVar3;
}

Assistant:

Totals runTests() {

            RunContext context( m_config.get(), m_reporter );

            Totals totals;

            context.testGroupStarting( "all tests", 1, 1 ); // deprecated?

            TestSpec testSpec = m_config->testSpec();
            if( !testSpec.hasFilters() )
                testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "~[.]" ).testSpec(); // All not hidden tests

            std::vector<TestCase> testCases;
            getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, *m_config, testCases );

            int testsRunForGroup = 0;
            for( std::vector<TestCase>::const_iterator it = testCases.begin(), itEnd = testCases.end();
                    it != itEnd;
                    ++it ) {
                testsRunForGroup++;
                if( m_testsAlreadyRun.find( *it ) == m_testsAlreadyRun.end() ) {

                    if( context.aborting() )
                        break;

                    totals += context.runTest( *it );
                    m_testsAlreadyRun.insert( *it );
                }
            }
            std::vector<TestCase> skippedTestCases;
            getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, *m_config, skippedTestCases, true );

            for( std::vector<TestCase>::const_iterator it = skippedTestCases.begin(), itEnd = skippedTestCases.end();
                    it != itEnd;
                    ++it )
                m_reporter->skipTest( *it );

            context.testGroupEnded( "all tests", totals, 1, 1 );
            return totals;
        }